

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O1

void gflags::anon_unknown_5::
     Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine
     ::Run(void)

{
  int32 iVar1;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  undefined8 local_18;
  
  FlagSaver::FlagSaver(&local_40);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUsesLastDefinitionTest",
          "WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine");
  local_38 = "my_test";
  local_30 = "--test_flag=0";
  local_28 = GetFlagFileFlag();
  local_20 = "--test_flag=3";
  local_18 = 0;
  iVar1 = ParseTestFlag(true,4,&local_38);
  if (iVar1 == 3) {
    iVar1 = ParseTestFlag(false,4,&local_38);
    if (iVar1 == 3) {
      FlagSaver::~FlagSaver(&local_40);
      return;
    }
  }
  else {
    _GLOBAL__N_1::
    Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine
    ::Run();
  }
  _GLOBAL__N_1::
  Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine
  ::Run();
  FlagSaver::~FlagSaver(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ParseCommandLineFlagsUsesLastDefinitionTest,
     WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine) {
  const char* argv[] = {
    "my_test",
    "--test_flag=0",
    GetFlagFileFlag(),
    "--test_flag=3",
    NULL,
  };

  EXPECT_EQ(3, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(3, ParseTestFlag(false, arraysize(argv) - 1, argv));
}